

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  undefined1 auVar4 [12];
  ulong uVar5;
  ulong uVar6;
  ulong extraout_RAX;
  char *pcVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  uint res;
  ulong uVar9;
  ParseContext *ctx_00;
  RepeatedField<unsigned_int> *this;
  uint *puVar10;
  byte *p;
  ulong uVar11;
  pair<const_char_*,_unsigned_int> pVar12;
  
  puVar10 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar10 & 3) == 0) {
    this = (RepeatedField<unsigned_int> *)((long)&msg->_vptr_MessageLite + (ulong)*puVar10);
    if (((ulong)this & 7) != 0) {
      AlignFail(this);
    }
    puVar10 = *(uint **)((long)&table->has_bits_offset +
                        (ulong)(ushort)puVar10[2] * 8 + (ulong)table->aux_offset);
    do {
      uVar11 = (ulong)*ptr;
      if ((long)uVar11 < 0) {
        uVar5 = (long)ptr[1] << 7 | 0x7f;
        if ((long)uVar5 < 0) {
          aVar8.data = (long)ptr[2] << 0xe | 0x3fff;
          if ((long)aVar8 < 0) {
            uVar5 = uVar5 & ((long)ptr[3] << 0x15 | 0x1fffffU);
            if ((long)uVar5 < 0) {
              pcVar7 = (char *)0xffffffffffffff80;
              aVar8.data = aVar8.data & ((long)ptr[4] << 0x1c | 0xfffffffU);
              if ((long)aVar8.data < 0) {
                uVar5 = uVar5 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
                if ((long)uVar5 < 0) {
                  aVar8.data = aVar8.data & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
                  if ((long)aVar8 < 0) {
                    uVar5 = uVar5 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                    if ((long)uVar5 < 0) {
                      uVar6 = (ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff;
                      aVar8.data = aVar8.data & uVar6;
                      if ((long)aVar8 < 0) {
                        p = (byte *)(ptr + 10);
                        cVar3 = ptr[9];
                        ctx_00 = (ParseContext *)CONCAT71((int7)(uVar6 >> 8),cVar3);
                        if ((cVar3 != '\x01') && (cVar3 < '\0')) goto LAB_00299f9f;
                      }
                      else {
                        p = (byte *)(ptr + 9);
                      }
                    }
                    else {
                      p = (byte *)(ptr + 8);
                    }
                  }
                  else {
                    p = (byte *)(ptr + 7);
                  }
                }
                else {
                  p = (byte *)(ptr + 6);
                }
              }
              else {
                p = (byte *)(ptr + 5);
              }
            }
            else {
              p = (byte *)(ptr + 4);
            }
          }
          else {
            p = (byte *)(ptr + 3);
          }
          uVar5 = uVar5 & aVar8.data;
        }
        else {
          p = (byte *)(ptr + 2);
        }
        uVar11 = uVar11 & uVar5;
      }
      else {
        p = (byte *)(ptr + 1);
      }
      uVar9 = (ulong)(*puVar10 >> 0x10);
      uVar5 = (long)(int)(uint)uVar11 - (long)(short)*puVar10;
      uVar6 = uVar5 - uVar9;
      if (uVar9 <= uVar5) {
        if (uVar6 < (puVar10[1] & 0xffff)) {
          if ((puVar10[(uVar6 >> 5) + 2] >> ((uint)uVar6 & 0x1f) & 1) == 0) {
LAB_00299fcd:
            pcVar7 = MpUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
            return pcVar7;
          }
        }
        else {
          MpRepeatedVarintT<false,unsigned_int,(unsigned_short)1024>();
          if ((extraout_RAX & 1) != 0) goto LAB_00299fcd;
        }
      }
      RepeatedField<unsigned_int>::Add(this,(uint)uVar11);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) break;
      bVar1 = *p;
      auVar4[8] = bVar1;
      auVar4._0_8_ = p + 1;
      auVar4._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = p[1];
        aVar8.data = (ulong)bVar2 << 7;
        res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)res;
          pVar12 = ReadTagFallback((char *)p,res);
          auVar4 = pVar12._0_12_;
          ctx_00 = pVar12._8_8_;
          if (pVar12.first == (char *)0x0) {
LAB_00299f9f:
            pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)aVar8,table,hasbits);
            return pcVar7;
          }
        }
        else {
          auVar4._8_4_ = res;
          auVar4._0_8_ = p + 2;
        }
      }
      ptr = auVar4._0_8_;
    } while (auVar4._8_4_ == data.field_0._0_4_);
    if ((ulong)table->has_bits_offset != 0) {
      puVar10 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar10 & 3) != 0) goto LAB_00299fc0;
      *puVar10 = *puVar10 | (uint)hasbits;
    }
    return (char *)p;
  }
LAB_00299fc0:
  AlignFail();
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}